

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmap.c
# Opt level: O0

void cmap_init_default(void)

{
  size_t i;
  ulong local_8;
  
  for (local_8 = 0; local_8 < 0x100; local_8 = local_8 + 1) {
    G_cmap_input[local_8] = (uchar)local_8;
  }
  for (local_8 = 0; local_8 < 0x100; local_8 = local_8 + 1) {
    G_cmap_output[local_8] = (uchar)local_8;
  }
  memset(G_cmap_id,0,5);
  strcpy(G_cmap_ldesc,"(native/no mapping)");
  S_cmap_loaded = 0;
  return;
}

Assistant:

void cmap_init_default(void)
{
    size_t i;

    /* initialize the input table */
    for (i = 0 ; i < sizeof(G_cmap_input)/sizeof(G_cmap_input[0]) ; ++i)
        G_cmap_input[i] = (unsigned char)i;

    /* initialize the output table */
    for (i = 0 ; i < sizeof(G_cmap_output)/sizeof(G_cmap_output[0]) ; ++i)
        G_cmap_output[i] = (unsigned char)i;

    /* we have a null ID */
    memset(G_cmap_id, 0, sizeof(G_cmap_id));

    /* indicate that it's the default */
    strcpy(G_cmap_ldesc, "(native/no mapping)");

    /* note that we have no character set loaded */
    S_cmap_loaded = FALSE;
}